

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O0

void __thiscall settings::~settings(settings *this)

{
  string *in_RDI;
  __shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr
  ;
  string *rhs;
  
  rhs = in_RDI;
  std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::reset
            (unaff_retaddr);
  booster::intrusive_ptr<cppcms::impl::base_cache>::operator=
            ((intrusive_ptr<cppcms::impl::base_cache> *)unaff_retaddr,(base_cache *)rhs);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)in_RDI);
  booster::shared_object::~shared_object((shared_object *)(in_RDI + 0x48));
  std::shared_ptr<cppcms::sessions::session_storage_factory>::~shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage_factory> *)0x109e6a);
  cppcms::json::value::~value((value *)0x109e78);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~settings()
	{
		sessions.reset(); // ensure that sessions object is destroyed before shared object
		cache = 0;
	}